

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_avx2.c
# Opt level: O0

_Bool aom_compute_mean_stddev_avx2
                (uchar *frame,int stride,int x,int y,double *mean,double *one_over_stddev)

{
  double __x;
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double *in_R8;
  double *in_R9;
  double dVar3;
  double variance;
  int sumsq;
  int sum;
  __m128i tmp_4x32;
  __m256i tmp_8x32;
  __m256i partial_sum;
  __m256i ones;
  __m256i v;
  int i;
  __m256i sumsq_vec;
  __m256i sum_vec;
  int local_350;
  int iStack_34c;
  int iStack_348;
  int iStack_344;
  int local_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 (*local_230) [16];
  undefined1 local_50 [16];
  
  local_280 = ZEXT1632(ZEXT816(0));
  local_2a0 = ZEXT1632(ZEXT816(0));
  local_230 = (undefined1 (*) [16])(in_RDI + ((in_ECX + -7) * in_ESI + in_EDX + -7));
  for (local_2a4 = 0; local_2a4 < 0x10; local_2a4 = local_2a4 + 1) {
    auVar2 = vpmovzxbw_avx2(*local_230);
    local_280 = vpaddw_avx2(local_280,auVar2);
    auVar2 = vpmaddwd_avx2(auVar2,auVar2);
    local_2a0 = vpaddd_avx2(local_2a0,auVar2);
    local_230 = (undefined1 (*) [16])(*local_230 + in_ESI);
  }
  auVar2._8_2_ = 1;
  auVar2._10_2_ = 1;
  auVar2._12_2_ = 1;
  auVar2._14_2_ = 1;
  auVar2._0_2_ = 1;
  auVar2._2_2_ = 1;
  auVar2._4_2_ = 1;
  auVar2._6_2_ = 1;
  auVar2._16_2_ = 1;
  auVar2._18_2_ = 1;
  auVar2._20_2_ = 1;
  auVar2._22_2_ = 1;
  auVar2._24_2_ = 1;
  auVar2._26_2_ = 1;
  auVar2._28_2_ = 1;
  auVar2._30_2_ = 1;
  auVar2 = vpmaddwd_avx2(local_280,auVar2);
  auVar2 = vphaddd_avx2(auVar2,local_2a0);
  auVar1 = vpaddd_avx(auVar2._16_16_,local_50);
  local_350 = auVar1._0_4_;
  iStack_34c = auVar1._4_4_;
  iStack_348 = auVar1._8_4_;
  iStack_344 = auVar1._12_4_;
  *in_R8 = (double)(local_350 + iStack_34c) / 16.0;
  __x = -*in_R8 * *in_R8 + (double)(iStack_348 + iStack_344);
  if (256.0 <= __x) {
    dVar3 = sqrt(__x);
    *in_R9 = 1.0 / dVar3;
  }
  else {
    *in_R9 = 0.0;
  }
  return 256.0 <= __x;
}

Assistant:

bool aom_compute_mean_stddev_avx2(const unsigned char *frame, int stride, int x,
                                  int y, double *mean,
                                  double *one_over_stddev) {
  __m256i sum_vec = _mm256_setzero_si256();
  __m256i sumsq_vec = _mm256_setzero_si256();

  frame += (y - MATCH_SZ_BY2) * stride + (x - MATCH_SZ_BY2);

  for (int i = 0; i < MATCH_SZ; ++i) {
    const __m256i v = _mm256_cvtepu8_epi16(_mm_loadu_si128((__m128i *)frame));

    sum_vec = _mm256_add_epi16(sum_vec, v);
    sumsq_vec = _mm256_add_epi32(sumsq_vec, _mm256_madd_epi16(v, v));

    frame += stride;
  }

  // Reduce sum_vec and sumsq_vec into single values
  // Start by reducing each vector to 8x32-bit values, hadd() to perform 8
  // additions, sum vertically to do 4 more, then the last 2 in scalar code.
  const __m256i ones = _mm256_load_si256((__m256i *)ones_array);
  const __m256i partial_sum = _mm256_madd_epi16(sum_vec, ones);
  const __m256i tmp_8x32 = _mm256_hadd_epi32(partial_sum, sumsq_vec);
  const __m128i tmp_4x32 = _mm_add_epi32(_mm256_extracti128_si256(tmp_8x32, 0),
                                         _mm256_extracti128_si256(tmp_8x32, 1));
  const int sum =
      _mm_extract_epi32(tmp_4x32, 0) + _mm_extract_epi32(tmp_4x32, 1);
  const int sumsq =
      _mm_extract_epi32(tmp_4x32, 2) + _mm_extract_epi32(tmp_4x32, 3);

  *mean = (double)sum / MATCH_SZ;
  const double variance = sumsq - (*mean) * (*mean);
  if (variance < MIN_FEATURE_VARIANCE) {
    *one_over_stddev = 0.0;
    return false;
  }
  *one_over_stddev = 1.0 / sqrt(variance);
  return true;
}